

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitHop.c
# Opt level: O0

Hop_Obj_t * Kit_TruthToHop(Hop_Man_t *pMan,uint *pTruth,int nVars,Vec_Int_t *vMemory)

{
  Vec_Int_t *vMemory_00;
  Hop_Obj_t *pHVar1;
  Kit_Graph_t *local_38;
  Kit_Graph_t *pGraph;
  Hop_Obj_t *pObj;
  Vec_Int_t *vMemory_local;
  int nVars_local;
  uint *pTruth_local;
  Hop_Man_t *pMan_local;
  
  if (vMemory == (Vec_Int_t *)0x0) {
    vMemory_00 = Vec_IntAlloc(0);
    local_38 = Kit_TruthToGraph(pTruth,nVars,vMemory_00);
    Vec_IntFree(vMemory_00);
  }
  else {
    local_38 = Kit_TruthToGraph(pTruth,nVars,vMemory);
  }
  if (local_38 == (Kit_Graph_t *)0x0) {
    printf("Kit_TruthToHop(): Converting truth table to AIG has failed for function:\n");
    Kit_DsdPrintFromTruth(pTruth,nVars);
    printf("\n");
  }
  pHVar1 = Kit_GraphToHop(pMan,local_38);
  Kit_GraphFree(local_38);
  return pHVar1;
}

Assistant:

Hop_Obj_t * Kit_TruthToHop( Hop_Man_t * pMan, unsigned * pTruth, int nVars, Vec_Int_t * vMemory )
{
    Hop_Obj_t * pObj;
    Kit_Graph_t * pGraph;
    // transform truth table into the decomposition tree
    if ( vMemory == NULL )
    {
        vMemory = Vec_IntAlloc( 0 );
        pGraph = Kit_TruthToGraph( pTruth, nVars, vMemory );
        Vec_IntFree( vMemory );
    }
    else
        pGraph = Kit_TruthToGraph( pTruth, nVars, vMemory );
    if ( pGraph == NULL )
    {
        printf( "Kit_TruthToHop(): Converting truth table to AIG has failed for function:\n" );
        Kit_DsdPrintFromTruth( pTruth, nVars ); printf( "\n" );
    }
    // derive the AIG for the decomposition tree
    pObj = Kit_GraphToHop( pMan, pGraph );
    Kit_GraphFree( pGraph );
    return pObj;
}